

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

string * duckdb::StrfTimeFormat::Format(timestamp_t timestamp,string *format_str)

{
  dtime_t time_00;
  timestamp_t timestamp_00;
  date_t date_00;
  dtime_t time_01;
  StrfTimeFormat *this;
  pointer pcVar1;
  string *in_RDI;
  unique_ptr<char[],_std::default_delete<char>,_false> result;
  idx_t len;
  dtime_t time;
  date_t date;
  StrfTimeFormat format;
  StrTimeFormat *in_stack_00000230;
  string *in_stack_00000238;
  StrfTimeFormat *in_stack_fffffffffffffe70;
  timestamp_t in_stack_fffffffffffffe78;
  allocator *paVar2;
  char *tz_name;
  undefined4 in_stack_fffffffffffffeb0;
  int32_t in_stack_fffffffffffffeb4;
  StrfTimeFormat *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  date_t in_stack_fffffffffffffecc;
  string local_f0 [32];
  char local_d0 [208];
  
  tz_name = local_d0;
  StrfTimeFormat(in_stack_fffffffffffffe70);
  StrTimeFormat::ParseFormatSpecifier(in_stack_00000238,in_stack_00000230);
  ::std::__cxx11::string::~string(local_f0);
  date_00 = Timestamp::GetDate(in_stack_fffffffffffffe78);
  timestamp_00.value._4_4_ = in_stack_fffffffffffffecc.days;
  timestamp_00.value._0_4_ = in_stack_fffffffffffffec8;
  time_01 = Timestamp::GetTime(timestamp_00);
  time_00.micros._4_4_ = in_stack_fffffffffffffec4;
  time_00.micros._0_4_ = in_stack_fffffffffffffec0;
  this = (StrfTimeFormat *)
         GetLength(in_stack_fffffffffffffeb8,in_stack_fffffffffffffecc,time_00,
                   in_stack_fffffffffffffeb4,tz_name);
  make_unsafe_uniq_array_uninitialized<char>(in_stack_fffffffffffffe78.value);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffe70);
  FormatString((StrfTimeFormat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               date_00,time_01,tz_name);
  pcVar1 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffe70)
  ;
  paVar2 = (allocator *)&stack0xfffffffffffffeb7;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)in_RDI,pcVar1,(ulong)this,paVar2);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
  unique_ptr<char[],_std::default_delete<char>,_false>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char>,_false> *)0x13ebe1d);
  ~StrfTimeFormat(this);
  return in_RDI;
}

Assistant:

string StrfTimeFormat::Format(timestamp_t timestamp, const string &format_str) {
	StrfTimeFormat format;
	format.ParseFormatSpecifier(format_str, format);

	auto date = Timestamp::GetDate(timestamp);
	auto time = Timestamp::GetTime(timestamp);

	auto len = format.GetLength(date, time, 0, nullptr);
	auto result = make_unsafe_uniq_array_uninitialized<char>(len);
	format.FormatString(date, time, result.get());
	return string(result.get(), len);
}